

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O3

int __thiscall CVmObjFile::read_file(CVmObjFile *this,char *buf,int32_t *len)

{
  char *pcVar1;
  CVmDataSource *fp;
  vmobjfile_readbuf_t *this_00;
  int iVar2;
  int iVar3;
  CCharmapToUni *charmap;
  size_t sVar4;
  wchar_t ch;
  size_t b;
  wchar_t local_44;
  char *local_40;
  size_t local_38;
  
  pcVar1 = (this->super_CVmObject).ext_;
  fp = *(CVmDataSource **)(pcVar1 + 8);
  iVar2 = 0;
  if (fp != (CVmDataSource *)0x0 && (pcVar1[0x18] & 1U) == 0) {
    local_40 = buf;
    switch_read_write_mode(this,0);
    pcVar1 = (this->super_CVmObject).ext_;
    if (pcVar1[0x14] == '\x03') {
      iVar2 = (*fp->_vptr_CVmDataSource[3])(fp,local_40,(long)*len);
    }
    else {
      if (pcVar1[0x14] != '\x01') {
        return 0;
      }
      this_00 = *(vmobjfile_readbuf_t **)(pcVar1 + 0x20);
      charmap = CVmObjCharSet::get_to_uni
                          ((CVmObjCharSet *)
                           ((long)&G_obj_table_X.pages_[*(uint *)(pcVar1 + 0x10) >> 0xc]->ptr_ +
                           (ulong)((*(uint *)(pcVar1 + 0x10) & 0xfff) * 0x18)));
      iVar2 = vmobjfile_readbuf_t::peekch(this_00,&local_44,fp,charmap,&local_38);
      if (iVar2 == 0) {
        iVar2 = 0;
      }
      else {
        iVar2 = 0;
        do {
          iVar3 = 3 - (uint)((uint)local_44 < 0x800);
          if (local_44 < L'\x80') {
            iVar3 = 1;
          }
          if (*len < iVar3 + iVar2) break;
          sVar4 = utf8_ptr::s_putch(local_40 + iVar2,local_44);
          this_00->ptr = this_00->ptr + local_38;
          iVar2 = (int)sVar4 + iVar2;
          this_00->rem = this_00->rem - local_38;
          iVar3 = vmobjfile_readbuf_t::peekch(this_00,&local_44,fp,charmap,&local_38);
        } while (iVar3 != 0);
      }
    }
    *len = iVar2;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int CVmObjFile::read_file(VMG_ char *buf, int32_t &len)
{
    /* get the data source */
    CVmDataSource *fp = get_ext()->fp;

    /* make sure it's valid */
    if ((get_ext()->flags & VMOBJFILE_OUT_OF_SYNC) != 0 || fp == 0)
        return FALSE;

    /* deal with stdio buffering if we're changing modes */
    switch_read_write_mode(vmg_ FALSE);

    /* read according to the mode */
    switch (get_ext()->mode)
    {
    case VMOBJFILE_MODE_TEXT:
        {
            /* get the read buffer and character mapper */
            vmobjfile_readbuf_t *readbuf = get_ext()->readbuf;
            CCharmapToUni *charmap =
                ((CVmObjCharSet *)vm_objp(vmg_ get_ext()->charset))
                ->get_to_uni(vmg0_);

            /* loop until we satisfy the request */
            int32_t actual;
            for (actual = 0 ; ; )
            {
                /* peek at the next character */
                wchar_t ch;
                size_t b;
                if (!readbuf->peekch(ch, fp, charmap, b))
                    break;

                /* make sure it'll fit */
                size_t csiz = utf8_ptr::s_wchar_size(ch);
                if (actual + (int32_t)csiz > len)
                    break;

                /* store this character */
                actual += utf8_ptr::s_putch(buf + actual, ch);

                /* advance to the next character */
                readbuf->commit_peek(b);
            }

            /* set the actual return length */
            len = actual;
        }
        break;

    case VMOBJFILE_MODE_RAW:
        /* do the direct read */
        len = fp->readc(buf, (size_t)len);
        break;

    default:
        /* can't handle others */
        return FALSE;
    }

    /* success */
    return TRUE;
}